

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseImageCopy.c
# Opt level: O0

int TestSparseImageSplit(IceTImage image)

{
  IceTSizeType IVar1;
  IceTSizeType IVar2;
  IceTSizeType width_00;
  IceTSizeType IVar3;
  int iVar4;
  void *buffer;
  IceTSparseImage compressed_image;
  void *pvVar5;
  IceTSparseImage IVar6;
  IceTInt result_1;
  IceTInt result;
  uint local_e8;
  IceTInt partition;
  IceTSizeType num_partition_pixels;
  IceTSizeType height;
  IceTSizeType width;
  IceTSparseImage compare_sparse;
  IceTVoid *compare_sparse_buffer;
  IceTSizeType offsets [7];
  IceTSparseImage sparse_partition [7];
  IceTVoid *sparse_partition_buffer [7];
  IceTSparseImage full_sparse;
  IceTVoid *full_sparse_buffer;
  IceTImage image_local;
  
  IVar1 = icetImageGetWidth(image);
  IVar2 = icetImageGetHeight(image);
  width_00 = icetSparseImageSplitPartitionNumPixels(IVar1 * IVar2,7,7);
  IVar3 = icetSparseImageBufferSize(IVar1,IVar2);
  buffer = malloc((long)IVar3);
  compressed_image = icetSparseImageAssignBuffer(buffer,IVar1,IVar2);
  for (local_e8 = 0; (int)local_e8 < 7; local_e8 = local_e8 + 1) {
    IVar1 = icetSparseImageBufferSize(width_00,1);
    pvVar5 = malloc((long)IVar1);
    sparse_partition_buffer[(long)(int)local_e8 + -1] = pvVar5;
    IVar6 = icetSparseImageAssignBuffer
                      (sparse_partition_buffer[(long)(int)local_e8 + -1],width_00,1);
    *(IceTVoid **)(offsets + (long)(int)local_e8 * 2 + 6) = IVar6.opaque_internals;
  }
  IVar1 = icetSparseImageBufferSize(width_00,1);
  pvVar5 = malloc((long)IVar1);
  IVar6 = icetSparseImageAssignBuffer(pvVar5,width_00,1);
  icetCompressImage(image,compressed_image);
  printf("Spliting image %d times\n");
  icetSparseImageSplit
            (compressed_image,0,7,7,(IceTSparseImage *)(offsets + 6),
             (IceTSizeType *)&compare_sparse_buffer);
  for (local_e8 = 0; (int)local_e8 < 7; local_e8 = local_e8 + 1) {
    IVar1 = offsets[(long)(int)local_e8 + -2];
    IVar2 = icetSparseImageGetNumPixels
                      ((IceTSparseImage)*(IceTVoid **)(offsets + (long)(int)local_e8 * 2 + 6));
    icetCompressSubImage(image,IVar1,IVar2,IVar6);
    printf("    Comparing partition %d\n",(ulong)local_e8);
    iVar4 = CompareSparseImages(IVar6,(IceTSparseImage)
                                      *(IceTVoid **)(offsets + (long)(int)local_e8 * 2 + 6));
    if (iVar4 != 0) {
      return iVar4;
    }
  }
  printf("Spliting image %d times with first partition in place.\n");
  unique0x1000048b = compressed_image;
  icetSparseImageSplit
            (compressed_image,0,7,7,(IceTSparseImage *)(offsets + 6),
             (IceTSizeType *)&compare_sparse_buffer);
  local_e8 = 0;
  while( true ) {
    if (6 < (int)local_e8) {
      free(buffer);
      for (local_e8 = 0; (int)local_e8 < 7; local_e8 = local_e8 + 1) {
        free(sparse_partition_buffer[(long)(int)local_e8 + -1]);
      }
      free(pvVar5);
      return 0;
    }
    IVar1 = offsets[(long)(int)local_e8 + -2];
    IVar2 = icetSparseImageGetNumPixels
                      ((IceTSparseImage)*(IceTVoid **)(offsets + (long)(int)local_e8 * 2 + 6));
    icetCompressSubImage(image,IVar1,IVar2,IVar6);
    printf("    Comparing partition %d\n",(ulong)local_e8);
    iVar4 = CompareSparseImages(IVar6,(IceTSparseImage)
                                      *(IceTVoid **)(offsets + (long)(int)local_e8 * 2 + 6));
    if (iVar4 != 0) break;
    local_e8 = local_e8 + 1;
  }
  return iVar4;
}

Assistant:

static int TestSparseImageSplit(const IceTImage image)
{
#define NUM_PARTITIONS 7
    IceTVoid *full_sparse_buffer;
    IceTSparseImage full_sparse;
    IceTVoid *sparse_partition_buffer[NUM_PARTITIONS];
    IceTSparseImage sparse_partition[NUM_PARTITIONS];
    IceTSizeType offsets[NUM_PARTITIONS];
    IceTVoid *compare_sparse_buffer;
    IceTSparseImage compare_sparse;

    IceTSizeType width;
    IceTSizeType height;
    IceTSizeType num_partition_pixels;

    IceTInt partition;

    width = icetImageGetWidth(image);
    height = icetImageGetHeight(image);
    num_partition_pixels
        = icetSparseImageSplitPartitionNumPixels(width*height,
                                                 NUM_PARTITIONS,
                                                 NUM_PARTITIONS);

    full_sparse_buffer = malloc(icetSparseImageBufferSize(width, height));
    full_sparse = icetSparseImageAssignBuffer(full_sparse_buffer,width,height);

    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        sparse_partition_buffer[partition]
            = malloc(icetSparseImageBufferSize(num_partition_pixels, 1));
        sparse_partition[partition]
            = icetSparseImageAssignBuffer(sparse_partition_buffer[partition],
                                          num_partition_pixels, 1);
    }

    compare_sparse_buffer
        = malloc(icetSparseImageBufferSize(num_partition_pixels, 1));
    compare_sparse
        = icetSparseImageAssignBuffer(compare_sparse_buffer,
                                      num_partition_pixels, 1);

    icetCompressImage(image, full_sparse);

    printf("Spliting image %d times\n", NUM_PARTITIONS);
    icetSparseImageSplit(full_sparse,
                         0,
                         NUM_PARTITIONS,
                         NUM_PARTITIONS,
                         sparse_partition,
                         offsets);
    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        IceTInt result;
        icetCompressSubImage(image,
                             offsets[partition],
                             icetSparseImageGetNumPixels(
                                                   sparse_partition[partition]),
                             compare_sparse);
        printf("    Comparing partition %d\n", partition);
        result = CompareSparseImages(compare_sparse,
                                     sparse_partition[partition]);
        if (result != TEST_PASSED) return result;
    }

    printf("Spliting image %d times with first partition in place.\n",
           NUM_PARTITIONS);
    sparse_partition[0] = full_sparse;
    icetSparseImageSplit(full_sparse,
                         0,
                         NUM_PARTITIONS,
                         NUM_PARTITIONS,
                         sparse_partition,
                         offsets);
    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        IceTInt result;
        icetCompressSubImage(image,
                             offsets[partition],
                             icetSparseImageGetNumPixels(
                                                   sparse_partition[partition]),
                             compare_sparse);
        printf("    Comparing partition %d\n", partition);
        result = CompareSparseImages(compare_sparse,
                                     sparse_partition[partition]);
        if (result != TEST_PASSED) return result;
    }

    free(full_sparse_buffer);
    for (partition = 0; partition < NUM_PARTITIONS; partition++) {
        free(sparse_partition_buffer[partition]);
    }
    free(compare_sparse_buffer);

    return TEST_PASSED;
#undef NUM_PARTITIONS
}